

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCA.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  network_address_t dst;
  reference this;
  reference this_00;
  pointer pNVar2;
  Network *this_01;
  ostream *poVar3;
  void *this_02;
  rep_conflict rVar4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_238;
  duration<long,_std::ratio<1L,_1000000000L>_> local_230;
  duration<double,_std::ratio<1L,_1L>_> local_228;
  duration<double,_std::ratio<1L,_1L>_> diff;
  int local_214;
  undefined1 local_210 [4];
  int j;
  undefined1 local_1f0 [40];
  Message request;
  string local_120 [32];
  string local_100 [8];
  string str;
  int local_dc;
  int i_1;
  unique_ptr<Node,_std::default_delete<Node>_> *node;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  *__range1;
  value_type local_a8;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  nodes;
  Client client;
  time_point start;
  
  client.accepted_reply._M_t._M_impl.super__Rb_tree_header._M_node_count =
       std::chrono::_V2::system_clock::now();
  Client::Client((Client *)
                 &nodes.
                  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ::vector((vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
            *)local_98);
  for (local_9c = 0; local_9c < 10; local_9c = local_9c + 1) {
    std::make_unique<Node>();
    std::
    vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
    ::push_back((vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                 *)local_98,&local_a8);
    std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(&local_a8);
  }
  __end1 = std::
           vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
           ::begin((vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                    *)local_98);
  node = (unique_ptr<Node,_std::default_delete<Node>_> *)
         std::
         vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
         ::end((vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                *)local_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<Node,_std::default_delete<Node>_>_*,_std::vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>_>
                                     *)&node), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<Node,_std::default_delete<Node>_>_*,_std::vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>_>
           ::operator*(&__end1);
    pNVar2 = std::unique_ptr<Node,_std::default_delete<Node>_>::operator->(this);
    Node::SetAllNodes(pNVar2,(vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                              *)local_98);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Node,_std::default_delete<Node>_>_*,_std::vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>_>
    ::operator++(&__end1);
  }
  for (local_dc = 0; local_dc < 12000; local_dc = local_dc + 1) {
    std::__cxx11::string::string(local_100);
    std::__cxx11::to_string((__cxx11 *)&request.field_0x88,local_dc);
    std::operator+((char *)local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Test");
    std::__cxx11::string::operator=(local_100,local_120);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)&request.field_0x88);
    Message::Message((Message *)(local_1f0 + 0x20),REQUEST);
    request._32_8_ = time((time_t *)0x0);
    std::__cxx11::string::operator=((string *)&request,local_100);
    request.t._0_4_ =
         NetworkNode::GetNodeAddress
                   ((NetworkNode *)
                    &nodes.
                     super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    request.n._0_4_ = (network_address_t)request.t;
    Message::diggest_abi_cxx11_((Message *)local_1f0);
    std::__cxx11::string::operator=((string *)&request.c,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    Message::str_abi_cxx11_((Message *)local_210);
    std::__cxx11::string::operator=((string *)&request.i,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    for (local_214 = 0; local_214 < 10; local_214 = local_214 + 1) {
      this_00 = std::
                vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                ::operator[]((vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                              *)local_98,(long)local_214);
      pNVar2 = std::unique_ptr<Node,_std::default_delete<Node>_>::operator->(this_00);
      dst = NetworkNode::GetNodeAddress(&pNVar2->super_NetworkNode);
      Client::SendRequest((Client *)
                          &nodes.
                           super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,dst,
                          (Message *)(local_1f0 + 0x20));
    }
    Message::~Message((Message *)(local_1f0 + 0x20));
    std::__cxx11::string::~string(local_100);
  }
  while( true ) {
    this_01 = Network::instance();
    bVar1 = Network::Empty(this_01);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    diff.__r = (rep_conflict)s<(char)49>();
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&diff);
  }
  local_238.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_230.__r =
       (rep)std::chrono::operator-
                      (&local_238,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&client.accepted_reply._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_228,&local_230);
  poVar3 = std::operator<<((ostream *)&std::cout,"elapsed: ");
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_228);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  poVar3 = std::operator<<(poVar3," seconds");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"TPS: ");
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_228);
  this_02 = (void *)std::ostream::operator<<(poVar3,12000.0 / rVar4);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ::~vector((vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
             *)local_98);
  Client::~Client((Client *)
                  &nodes.
                   super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main()
{
    using namespace std::chrono;
    auto start = system_clock::now();

    Client client;
    std::vector<std::unique_ptr<Node>> nodes;
    for (int i = 0; i < Num_Node; i++)
    {
        nodes.push_back(std::make_unique<Node>());
    }

    for (auto & node : nodes)
    {
        node->SetAllNodes(nodes);
    }
    for(int i = 0; i < NUMOFTRANS; i++)
    {
        std::string str;
        str = "Test"+ to_string(i);
        Message request(Message::REQUEST);
        request.t = std::time(nullptr);
        request.o = str;
        request.c = request.i = client.GetNodeAddress();
        request.d = request.diggest();
        request.m = request.str();
        for(int j = 0; j < Num_Node; j++)
        {
          client.SendRequest(nodes[j]->GetNodeAddress(),request);
        }
    }
    while (!Network::instance().Empty())
        std::this_thread::sleep_for(1s);

    duration<double> diff = system_clock::now() - start;
    cout<<"elapsed: " << diff.count() << " seconds" <<endl;
    cout<<"TPS: " << NUMOFTRANS/diff.count()<<endl;

	return 0;
}